

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
LiteScript::Script::GetInstructionList
          (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
           *__return_storage_ptr__,char *code,ErrorType *err,uint *line_err,uint *col_error)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  String str;
  ulong uVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = Syntax::ReadScript(code,__return_storage_ptr__,err);
  if (iVar1 < 0) {
    *line_err = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar4 = 0;
    while (uVar3 = uVar4 + 1, uVar3 - (uint)-iVar1 != 1) {
      pcVar2 = code + uVar4;
      uVar4 = uVar3;
      if (*pcVar2 == '\n') {
        uVar5 = uVar5 + 1;
        *line_err = uVar5;
        uVar6 = uVar3 & 0xffffffff;
      }
    }
    iVar7 = -iVar1 - (int)uVar6;
    iVar1 = -1;
    if (-2 < iVar7) {
      iVar1 = iVar7 + 1;
    }
    pcVar2 = (char *)operator_new__((long)iVar1);
    memcpy(pcVar2,code + (int)uVar6,(long)iVar7);
    pcVar2[iVar7] = '\0';
    String::String(&str,pcVar2);
    uVar5 = String::GetLength(&str);
    *col_error = uVar5;
    std::__cxx11::u32string::~u32string((u32string *)&str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LiteScript::Instruction> LiteScript::Script::GetInstructionList(const char *code, Script::ErrorType &err,
                                                                            unsigned int &line_err,
                                                                            unsigned int &col_error) {
    std::vector<Instruction> list;
    int tmp;
    if ((tmp = LiteScript::Syntax::ReadScript(code, list, err)) < 0) {
        line_err = 0;
        tmp = -tmp;
        int sv = 0;
        for (int i = 0; i < tmp; i++) {
            if (code[i] == '\n') {
                line_err++;
                sv = i + 1;
            }
        }
        int len = tmp - sv;
        char * tmp_s = new char[len + 1];
        memcpy(tmp_s, code + sv, (size_t)len);
        tmp_s[len] = '\0';
        String str(tmp_s);
        col_error = str.GetLength();
    }
    return list;
}